

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O2

u32 __thiscall moira::Moira::divuMusashi<(moira::Core)0>(Moira *this,u32 op1,u32 op2)

{
  uint uVar1;
  u32 uVar2;
  
  uVar1 = op1 / op2;
  uVar2 = op1;
  if (0xffff >= uVar1) {
    uVar2 = op1 % op2 << 0x10 | uVar1;
    (this->reg).sr.z = op2 <= op1;
    (this->reg).sr.n = 0x7fff < uVar1;
    (this->reg).sr.c = false;
  }
  (this->reg).sr.v = 0xffff < uVar1;
  return uVar2;
}

Assistant:

u32
Moira::divuMusashi(u32 op1, u32 op2)
{
    u32 result;
    i64 quotient  = op1 / op2;
    u16 remainder = (u16)(op1 % op2);

    if(quotient < 0x10000) {

        result = (quotient & 0xffff) | remainder << 16;

        reg.sr.z = quotient;
        reg.sr.n = NBIT<Word>(quotient);
        reg.sr.v = 0;
        reg.sr.c = 0;

    } else {

        result = op1;
        reg.sr.v = 1;
    }

    return result;
}